

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

int __thiscall
FNodeBuilder::SelectSplitter
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg,int step,bool nosplit)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  DWORD DVar4;
  uchar *__s;
  FPrivSeg *pFVar5;
  byte *pbVar6;
  int value;
  int r;
  int l;
  FPrivSeg *pseg;
  uint local_48;
  uint uStack_44;
  bool nosplitters;
  DWORD seg;
  DWORD bestseg;
  int bestvalue;
  int stepleft;
  bool nosplit_local;
  int step_local;
  DWORD *splitseg_local;
  node_t *node_local;
  DWORD set_local;
  FNodeBuilder *this_local;
  
  bVar1 = false;
  seg = 0;
  uStack_44 = 0xffffffff;
  bestseg = 0;
  __s = TArray<unsigned_char,_unsigned_char>::operator[](&this->PlaneChecked,0);
  uVar2 = TArray<unsigned_char,_unsigned_char>::Size(&this->PlaneChecked);
  memset(__s,0,(ulong)uVar2);
  local_48 = set;
  while (local_48 != 0xffffffff) {
    pFVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_48);
    bestseg = bestseg - 1;
    if ((int)bestseg < 1) {
      iVar3 = pFVar5->planenum >> 3;
      uVar2 = 1 << ((byte)pFVar5->planenum & 7);
      if ((iVar3 < 0) ||
         (pbVar6 = TArray<unsigned_char,_unsigned_char>::operator[](&this->PlaneChecked,(long)iVar3)
         , (*pbVar6 & uVar2) == 0)) {
        if (-1 < iVar3) {
          pbVar6 = TArray<unsigned_char,_unsigned_char>::operator[](&this->PlaneChecked,(long)iVar3)
          ;
          *pbVar6 = *pbVar6 | (byte)uVar2;
        }
        SetNodeFromSeg(this,node,pFVar5);
        DVar4 = Heuristic(this,node,set,nosplit);
        bestseg = step;
        if ((int)seg < (int)DVar4) {
          uStack_44 = local_48;
          seg = DVar4;
        }
        else if ((int)DVar4 < 0) {
          bVar1 = true;
        }
      }
    }
    local_48 = pFVar5->next;
  }
  if (uStack_44 == 0xffffffff) {
    this_local._4_4_ = 0;
    if (bVar1) {
      this_local._4_4_ = -1;
    }
  }
  else {
    *splitseg = uStack_44;
    pFVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)uStack_44);
    SetNodeFromSeg(this,node,pFVar5);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int FNodeBuilder::SelectSplitter (DWORD set, node_t &node, DWORD &splitseg, int step, bool nosplit)
{
	int stepleft;
	int bestvalue;
	DWORD bestseg;
	DWORD seg;
	bool nosplitters = false;

	bestvalue = 0;
	bestseg = DWORD_MAX;

	seg = set;
	stepleft = 0;

	memset (&PlaneChecked[0], 0, PlaneChecked.Size());

	D(Printf (PRINT_LOG, "Processing set %d\n", set));

	while (seg != DWORD_MAX)
	{
		FPrivSeg *pseg = &Segs[seg];

		if (--stepleft <= 0)
		{
			int l = pseg->planenum >> 3;
			int r = 1 << (pseg->planenum & 7);

			if (l < 0 || (PlaneChecked[l] & r) == 0)
			{
				if (l >= 0)
				{
					PlaneChecked[l] |= r;
				}

				stepleft = step;
				SetNodeFromSeg (node, pseg);

				int value = Heuristic (node, set, nosplit);

				D(Printf (PRINT_LOG, "Seg %5d, ld %d (%5d,%5d)-(%5d,%5d) scores %d\n", seg, Segs[seg].linedef, node.x>>16, node.y>>16,
					(node.x+node.dx)>>16, (node.y+node.dy)>>16, value));

				if (value > bestvalue)
				{
					bestvalue = value;
					bestseg = seg;
				}
				else if (value < 0)
				{
					nosplitters = true;
				}
			}
		}

		seg = pseg->next;
	}

	if (bestseg == DWORD_MAX)
	{ // No lines split any others into two sets, so this is a convex region.
	D(Printf (PRINT_LOG, "set %d, step %d, nosplit %d has no good splitter (%d)\n", set, step, nosplit, nosplitters));
		return nosplitters ? -1 : 0;
	}

	D(Printf (PRINT_LOG, "split seg %u in set %d, score %d, step %d, nosplit %d\n", bestseg, set, bestvalue, step, nosplit));

	splitseg = bestseg;
	SetNodeFromSeg (node, &Segs[bestseg]);
	return 1;
}